

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerMSL::emit_store_statement
          (CompilerMSL *this,uint32_t lhs_expression,uint32_t rhs_expression)

{
  Variant *pVVar1;
  CompilerMSL *pCVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  uint32_t uVar7;
  uint uVar8;
  SPIRType *pSVar9;
  SPIRVariable *pSVar10;
  SPIRType *pSVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  long *plVar16;
  size_type *psVar17;
  char cVar18;
  char *in_R8;
  char (*in_R9) [2];
  char (*pacVar19) [3];
  char (*pacVar20) [2];
  uint local_3c8;
  uint local_3c4;
  CompilerMSL *local_3c0;
  SPIRType *local_3b8;
  SPIRExpression *local_3b0;
  string rhs_row;
  string unpacked_expr;
  SPIRExpression *local_360;
  string cast_expr;
  char *packed_pfx;
  string local_330;
  string cast_addr_space;
  SPIRType vector_type;
  SPIRType write_type;
  
  uVar13 = (ulong)lhs_expression;
  local_3b8 = Compiler::expression_type((Compiler *)this,rhs_expression);
  bVar3 = Compiler::has_extended_decoration
                    ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypeID);
  bVar4 = Compiler::has_extended_decoration
                    ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypePacked);
  uVar12 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.
           buffer_size;
  if ((uVar13 < uVar12) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar13].type == TypeExpression)) {
    local_3b0 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar13);
    uVar12 = (this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>
             .buffer_size;
  }
  else {
    local_3b0 = (SPIRExpression *)0x0;
  }
  uVar13 = (ulong)rhs_expression;
  if ((uVar13 < uVar12) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar13].type == TypeExpression)) {
    local_360 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar13);
  }
  else {
    local_360 = (SPIRExpression *)0x0;
  }
  if (local_3b0 == (SPIRExpression *)0x0) {
    bVar6 = 0;
  }
  else {
    bVar6 = local_3b0->need_transpose;
  }
  bVar5 = Compiler::has_decoration((Compiler *)this,(ID)lhs_expression,DecorationBuiltIn);
  if (((bVar5) &&
      (uVar7 = Compiler::get_decoration((Compiler *)this,(ID)lhs_expression,DecorationBuiltIn),
      uVar7 == 0x14)) && (bVar5 = Compiler::is_array((Compiler *)this,local_3b8), bVar5)) {
    CompilerGLSL::to_expression_abi_cxx11_
              ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
    CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
              ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
    CompilerGLSL::
    statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[5]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&write_type,
               (char (*) [4])0x2d3d47,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vector_type,
               (char (*) [5])0x2bd4e7);
    if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.basetype) {
      operator_delete(vector_type.super_IVariant._vptr_IVariant);
    }
    if (write_type.super_IVariant._vptr_IVariant != (_func_int **)&write_type.basetype) {
      operator_delete(write_type.super_IVariant._vptr_IVariant);
    }
  }
  else {
    pSVar9 = local_3b8;
    local_3c0 = this;
    if (bVar3 || bVar4) {
      if (bVar3) {
        uVar8 = Compiler::get_extended_decoration
                          ((Compiler *)this,lhs_expression,SPIRVCrossDecorationPhysicalTypeID);
      }
      else {
        bVar3 = Compiler::is_matrix((Compiler *)this,local_3b8);
        if (!bVar3 && (bVar6 & 1) == 0) goto LAB_00207db0;
        uVar8 = (pSVar9->super_IVariant).self.id;
      }
      pSVar9 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + uVar8);
      cast_addr_space._M_dataplus._M_p = (pointer)&cast_addr_space.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&cast_addr_space,"thread","");
      pSVar10 = Compiler::maybe_get_backing_variable((Compiler *)this,lhs_expression);
      if (pSVar10 != (SPIRVariable *)0x0) {
        pSVar11 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr +
                             *(uint *)&(pSVar10->super_IVariant).field_0xc);
        get_type_address_space_abi_cxx11_((string *)&write_type,this,pSVar11,lhs_expression,false);
        ::std::__cxx11::string::operator=((string *)&cast_addr_space,(string *)&write_type);
        if (write_type.super_IVariant._vptr_IVariant != (_func_int **)&write_type.basetype) {
          operator_delete(write_type.super_IVariant._vptr_IVariant);
        }
      }
      bVar3 = Compiler::is_matrix((Compiler *)this,local_3b8);
      pSVar11 = local_3b8;
      if (bVar3) {
        packed_pfx = "";
        if (bVar4) {
          packed_pfx = "packed_";
        }
        if (local_360 == (SPIRExpression *)0x0) {
          cVar18 = '\0';
        }
        else {
          cVar18 = local_360->need_transpose;
        }
        SPIRType::SPIRType(&write_type,local_3b8);
        pSVar11 = local_3b8;
        cast_expr._M_dataplus._M_p = (pointer)&cast_expr.field_2;
        cast_expr._M_string_length = 0;
        cast_expr.field_2._M_local_buf[0] = '\0';
        if (cVar18 != '\0') {
          local_360->need_transpose = false;
        }
        if (bVar6 == 0) {
          write_type.columns = 1;
          if (pSVar9->vecsize != local_3b8->vecsize) {
            pacVar19 = (char (*) [3])0x2085f6;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&rhs_row,this,&write_type,0);
            join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                      ((string *)&vector_type,(spirv_cross *)0x2d210e,(char (*) [2])&cast_addr_space
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x2bb1d1,(char (*) [2])&packed_pfx,(char **)&rhs_row,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2b9eee
                       ,pacVar19);
            ::std::__cxx11::string::operator=((string *)&cast_expr,(string *)&vector_type);
            if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.basetype) {
              operator_delete(vector_type.super_IVariant._vptr_IVariant);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
              operator_delete(rhs_row._M_dataplus._M_p);
            }
          }
          pCVar2 = local_3c0;
          if (cVar18 == '\0') {
            unpacked_expr._M_dataplus._M_p._0_4_ = 0;
            this = local_3c0;
            if (pSVar11->columns != 0) {
              do {
                CompilerGLSL::to_enclosed_expression_abi_cxx11_
                          ((string *)&vector_type,&pCVar2->super_CompilerGLSL,lhs_expression,true);
                CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                          (&rhs_row,&pCVar2->super_CompilerGLSL,rhs_expression,true);
                CompilerGLSL::
                statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                          (&pCVar2->super_CompilerGLSL,&cast_expr,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &vector_type,(char (*) [2])0x2be9ba,(uint *)&unpacked_expr,
                           (char (*) [2])0x2be8bf,(char (*) [4])0x2d3d47,&rhs_row,
                           (char (*) [2])0x2be9ba,(uint *)&unpacked_expr,(char (*) [3])0x2bd4e9);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
                  operator_delete(rhs_row._M_dataplus._M_p);
                }
                if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.basetype
                   ) {
                  operator_delete(vector_type.super_IVariant._vptr_IVariant);
                }
                unpacked_expr._M_dataplus._M_p._0_4_ = (uint)unpacked_expr._M_dataplus._M_p + 1;
                this = local_3c0;
              } while ((uint)unpacked_expr._M_dataplus._M_p < local_3b8->columns);
            }
          }
          else {
            pSVar9 = Compiler::expression_type((Compiler *)this,rhs_expression);
            SPIRType::SPIRType(&vector_type,pSVar9);
            pCVar2 = local_3c0;
            vector_type.columns = 1;
            local_3c4 = 0;
            if (pSVar11->columns != 0) {
              do {
                CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                          (&unpacked_expr,&local_3c0->super_CompilerGLSL,&vector_type);
                plVar16 = (long *)::std::__cxx11::string::append((char *)&unpacked_expr);
                rhs_row._M_dataplus._M_p = (pointer)&rhs_row.field_2;
                psVar17 = (size_type *)(plVar16 + 2);
                if ((size_type *)*plVar16 == psVar17) {
                  rhs_row.field_2._M_allocated_capacity = *psVar17;
                  rhs_row.field_2._8_8_ = plVar16[3];
                }
                else {
                  rhs_row.field_2._M_allocated_capacity = *psVar17;
                  rhs_row._M_dataplus._M_p = (pointer)*plVar16;
                }
                rhs_row._M_string_length = plVar16[1];
                *plVar16 = (long)psVar17;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                           (uint)unpacked_expr._M_dataplus._M_p));
                }
                local_3c8 = 0;
                if (vector_type.vecsize != 0) {
                  do {
                    pacVar20 = (char (*) [2])0x208782;
                    CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                              (&unpacked_expr,&local_3c0->super_CompilerGLSL,rhs_expression);
                    join<std::__cxx11::string&,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                              (&local_330,(spirv_cross *)&unpacked_expr,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x2be9ba,(char (*) [2])&local_3c8,(uint *)"][",
                               (char (*) [3])&local_3c4,(uint *)0x2be8bf,pacVar20);
                    ::std::__cxx11::string::_M_append
                              ((char *)&rhs_row,
                               CONCAT44(local_330._M_dataplus._M_p._4_4_,
                                        (uint)local_330._M_dataplus._M_p));
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_330._M_dataplus._M_p._4_4_,
                                    (uint)local_330._M_dataplus._M_p) != &local_330.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_330._M_dataplus._M_p._4_4_,
                                               (uint)local_330._M_dataplus._M_p));
                    }
                    if (local_3c8 + 1 < vector_type.vecsize) {
                      ::std::__cxx11::string::append((char *)&rhs_row);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                    (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2)
                    {
                      operator_delete((undefined1 *)
                                      CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                               (uint)unpacked_expr._M_dataplus._M_p));
                    }
                    local_3c8 = local_3c8 + 1;
                  } while (local_3c8 < vector_type.vecsize);
                }
                ::std::__cxx11::string::append((char *)&rhs_row);
                CompilerGLSL::to_enclosed_expression_abi_cxx11_
                          (&unpacked_expr,&pCVar2->super_CompilerGLSL,lhs_expression,true);
                CompilerGLSL::
                statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                          (&pCVar2->super_CompilerGLSL,&cast_expr,&unpacked_expr,
                           (char (*) [2])0x2be9ba,&local_3c4,(char (*) [2])0x2be8bf,
                           (char (*) [4])0x2d3d47,&rhs_row,(char (*) [2])0x2d3bdb);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                           (uint)unpacked_expr._M_dataplus._M_p));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
                  operator_delete(rhs_row._M_dataplus._M_p);
                }
                local_3c4 = local_3c4 + 1;
              } while (local_3c4 < local_3b8->columns);
            }
            vector_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0035c188;
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(&vector_type.member_name_cache._M_h);
            vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0
            ;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
                &vector_type.member_type_index_redirection.stack_storage) {
              free(vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
            }
            this = local_3c0;
            vector_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size = 0;
            if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                vector_type.member_types.
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
                &vector_type.member_types.stack_storage) {
              free(vector_type.member_types.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
            }
            vector_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
            if ((AlignedBuffer<bool,_8UL> *)
                vector_type.array_size_literal.super_VectorView<bool>.ptr !=
                &vector_type.array_size_literal.stack_storage) {
              free(vector_type.array_size_literal.super_VectorView<bool>.ptr);
            }
            vector_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                vector_type.array.super_VectorView<unsigned_int>.ptr !=
                &vector_type.array.stack_storage) {
              free(vector_type.array.super_VectorView<unsigned_int>.ptr);
            }
          }
        }
        else {
          local_3b0->need_transpose = false;
          write_type.columns = 1;
          write_type.vecsize = local_3b8->columns;
          if (pSVar9->columns != local_3b8->columns) {
            pacVar19 = (char (*) [3])0x20844e;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&rhs_row,this,&write_type,0);
            join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string,char_const(&)[3]>
                      ((string *)&vector_type,(spirv_cross *)0x2d210e,(char (*) [2])&cast_addr_space
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x2bb1d1,(char (*) [2])&packed_pfx,(char **)&rhs_row,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2b9eee
                       ,pacVar19);
            ::std::__cxx11::string::operator=((string *)&cast_expr,(string *)&vector_type);
            if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.basetype) {
              operator_delete(vector_type.super_IVariant._vptr_IVariant);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
              operator_delete(rhs_row._M_dataplus._M_p);
            }
          }
          pCVar2 = local_3c0;
          if (cVar18 == '\0') {
            pSVar9 = Compiler::expression_type((Compiler *)this,rhs_expression);
            SPIRType::SPIRType(&vector_type,pSVar9);
            pCVar2 = local_3c0;
            vector_type.vecsize = vector_type.columns;
            vector_type.columns = 1;
            local_3c4 = 0;
            if (pSVar11->vecsize != 0) {
              do {
                CompilerGLSL::type_to_glsl_constructor_abi_cxx11_
                          (&unpacked_expr,&local_3c0->super_CompilerGLSL,&vector_type);
                plVar16 = (long *)::std::__cxx11::string::append((char *)&unpacked_expr);
                rhs_row._M_dataplus._M_p = (pointer)&rhs_row.field_2;
                psVar17 = (size_type *)(plVar16 + 2);
                if ((size_type *)*plVar16 == psVar17) {
                  rhs_row.field_2._M_allocated_capacity = *psVar17;
                  rhs_row.field_2._8_8_ = plVar16[3];
                }
                else {
                  rhs_row.field_2._M_allocated_capacity = *psVar17;
                  rhs_row._M_dataplus._M_p = (pointer)*plVar16;
                }
                rhs_row._M_string_length = plVar16[1];
                *plVar16 = (long)psVar17;
                plVar16[1] = 0;
                *(undefined1 *)(plVar16 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                           (uint)unpacked_expr._M_dataplus._M_p));
                }
                local_3c8 = 0;
                if (vector_type.vecsize != 0) {
                  do {
                    pacVar20 = (char (*) [2])0x208a7b;
                    CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
                              (&local_330,&local_3c0->super_CompilerGLSL,rhs_expression,true);
                    join<std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                              (&unpacked_expr,(spirv_cross *)&local_330,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x2be9ba,(char (*) [2])&local_3c8,(uint *)"][",
                               (char (*) [3])&local_3c4,(uint *)0x2be8bf,pacVar20);
                    ::std::__cxx11::string::_M_append
                              ((char *)&rhs_row,
                               CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                        (uint)unpacked_expr._M_dataplus._M_p));
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                    (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2)
                    {
                      operator_delete((undefined1 *)
                                      CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                               (uint)unpacked_expr._M_dataplus._M_p));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_330._M_dataplus._M_p._4_4_,
                                    (uint)local_330._M_dataplus._M_p) != &local_330.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_330._M_dataplus._M_p._4_4_,
                                               (uint)local_330._M_dataplus._M_p));
                    }
                    uVar8 = local_3c8 + 1;
                    if (uVar8 < vector_type.vecsize) {
                      ::std::__cxx11::string::append((char *)&rhs_row);
                      uVar8 = local_3c8 + 1;
                    }
                    local_3c8 = uVar8;
                  } while (uVar8 < vector_type.vecsize);
                }
                ::std::__cxx11::string::append((char *)&rhs_row);
                CompilerGLSL::to_enclosed_expression_abi_cxx11_
                          (&unpacked_expr,&pCVar2->super_CompilerGLSL,lhs_expression,true);
                CompilerGLSL::
                statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                          (&pCVar2->super_CompilerGLSL,&cast_expr,&unpacked_expr,
                           (char (*) [2])0x2be9ba,&local_3c4,(char (*) [2])0x2be8bf,
                           (char (*) [4])0x2d3d47,&rhs_row,(char (*) [2])0x2d3bdb);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                           (uint)unpacked_expr._M_dataplus._M_p));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
                  operator_delete(rhs_row._M_dataplus._M_p);
                }
                local_3c4 = local_3c4 + 1;
              } while (local_3c4 < local_3b8->vecsize);
            }
            vector_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0035c188;
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::~_Hashtable(&vector_type.member_name_cache._M_h);
            vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0
            ;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
                &vector_type.member_type_index_redirection.stack_storage) {
              free(vector_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
            }
            this = local_3c0;
            vector_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size = 0;
            if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                vector_type.member_types.
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr !=
                &vector_type.member_types.stack_storage) {
              free(vector_type.member_types.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
            }
            vector_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
            if ((AlignedBuffer<bool,_8UL> *)
                vector_type.array_size_literal.super_VectorView<bool>.ptr !=
                &vector_type.array_size_literal.stack_storage) {
              free(vector_type.array_size_literal.super_VectorView<bool>.ptr);
            }
            vector_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
            if ((AlignedBuffer<unsigned_int,_8UL> *)
                vector_type.array.super_VectorView<unsigned_int>.ptr !=
                &vector_type.array.stack_storage) {
              free(vector_type.array.super_VectorView<unsigned_int>.ptr);
            }
          }
          else {
            unpacked_expr._M_dataplus._M_p._0_4_ = 0;
            this = local_3c0;
            if (pSVar11->vecsize != 0) {
              do {
                CompilerGLSL::to_enclosed_expression_abi_cxx11_
                          ((string *)&vector_type,&pCVar2->super_CompilerGLSL,lhs_expression,true);
                CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                          (&rhs_row,&pCVar2->super_CompilerGLSL,rhs_expression);
                CompilerGLSL::
                statement<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[2],char_const(&)[4],std::__cxx11::string,char_const(&)[2],unsigned_int&,char_const(&)[3]>
                          (&pCVar2->super_CompilerGLSL,&cast_expr,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &vector_type,(char (*) [2])0x2be9ba,(uint *)&unpacked_expr,
                           (char (*) [2])0x2be8bf,(char (*) [4])0x2d3d47,&rhs_row,
                           (char (*) [2])0x2be9ba,(uint *)&unpacked_expr,(char (*) [3])0x2bd4e9);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
                  operator_delete(rhs_row._M_dataplus._M_p);
                }
                if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.basetype
                   ) {
                  operator_delete(vector_type.super_IVariant._vptr_IVariant);
                }
                unpacked_expr._M_dataplus._M_p._0_4_ = (uint)unpacked_expr._M_dataplus._M_p + 1;
                this = local_3c0;
              } while ((uint)unpacked_expr._M_dataplus._M_p < local_3b8->vecsize);
            }
          }
          local_3b0->need_transpose = true;
        }
        if (cVar18 != '\0') {
          local_360->need_transpose = true;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)cast_expr._M_dataplus._M_p != &cast_expr.field_2) {
          operator_delete(cast_expr._M_dataplus._M_p);
        }
        write_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0035c188;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&write_type.member_name_cache._M_h);
        write_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)
            write_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
            &write_type.member_type_index_redirection.stack_storage) {
          free(write_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
        }
        write_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size = 0;
        if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
            write_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            ptr != &write_type.member_types.stack_storage) {
          free(write_type.member_types.
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
        }
        write_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
        if ((AlignedBuffer<bool,_8UL> *)write_type.array_size_literal.super_VectorView<bool>.ptr !=
            &write_type.array_size_literal.stack_storage) {
          free(write_type.array_size_literal.super_VectorView<bool>.ptr);
        }
        write_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)write_type.array.super_VectorView<unsigned_int>.ptr
            == &write_type.array.stack_storage) goto LAB_00208e0a;
      }
      else {
        if (bVar6 == 0) {
          bVar3 = Compiler::is_matrix((Compiler *)this,pSVar9);
          if (((bVar3) || (bVar3 = Compiler::is_array((Compiler *)this,pSVar9), bVar3)) &&
             ((pSVar9->vecsize < 5 && (local_3b8->vecsize < pSVar9->vecsize)))) {
            if (local_3b8->vecsize == 0) {
              __assert_fail("type.vecsize >= 1 && type.vecsize <= 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x158c,
                            "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                           );
            }
            if (bVar4) {
              __assert_fail("!lhs_packed_type",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_msl.cpp"
                            ,0x1592,
                            "virtual void spirv_cross::CompilerMSL::emit_store_statement(uint32_t, uint32_t)"
                           );
            }
            CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                      ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
            pSVar9 = local_3b8;
            CompilerGLSL::to_pointer_expression_abi_cxx11_
                      ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                      (&rhs_row,this,pSVar9,0);
            pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x208145;
            CompilerGLSL::enclose_expression
                      (&unpacked_expr,&this->super_CompilerGLSL,(string *)&write_type);
            join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string>
                      (&cast_expr,(spirv_cross *)0x2d210e,(char (*) [2])&cast_addr_space,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bb1d1
                       ,(char (*) [2])&rhs_row,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2b9eee
                       ,(char (*) [3])&unpacked_expr,pbVar15);
            ::std::__cxx11::string::operator=((string *)&write_type,(string *)&cast_expr);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)cast_expr._M_dataplus._M_p != &cast_expr.field_2) {
              operator_delete(cast_expr._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                            (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                       (uint)unpacked_expr._M_dataplus._M_p));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
              operator_delete(rhs_row._M_dataplus._M_p);
            }
            pSVar9 = Compiler::expression_type((Compiler *)this,rhs_expression);
            bVar3 = CompilerGLSL::optimize_read_modify_write
                              (&this->super_CompilerGLSL,pSVar9,(string *)&write_type,
                               (string *)&vector_type);
            if (!bVar3) {
              CompilerGLSL::
              statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &write_type,(char (*) [4])0x2d3d47,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vector_type,(char (*) [2])0x2d3bdb);
            }
            if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.basetype) {
              operator_delete(vector_type.super_IVariant._vptr_IVariant);
            }
            if (write_type.super_IVariant._vptr_IVariant == (_func_int **)&write_type.basetype)
            goto LAB_00208e0a;
          }
          else {
            bVar3 = Compiler::is_matrix((Compiler *)this,local_3b8);
            if (bVar3) goto LAB_00208e0a;
            CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                      ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
            CompilerGLSL::to_pointer_expression_abi_cxx11_
                      ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
            pSVar9 = Compiler::expression_type((Compiler *)this,rhs_expression);
            bVar3 = CompilerGLSL::optimize_read_modify_write
                              (&this->super_CompilerGLSL,pSVar9,(string *)&write_type,
                               (string *)&vector_type);
            if (!bVar3) {
              CompilerGLSL::
              statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                        (&this->super_CompilerGLSL,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &write_type,(char (*) [4])0x2d3d47,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &vector_type,(char (*) [2])0x2d3bdb);
            }
            if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.basetype) {
              operator_delete(vector_type.super_IVariant._vptr_IVariant);
            }
            if (write_type.super_IVariant._vptr_IVariant == (_func_int **)&write_type.basetype)
            goto LAB_00208e0a;
          }
          operator_delete(write_type.super_IVariant._vptr_IVariant);
          goto LAB_00208e0a;
        }
        local_3b0->need_transpose = false;
        SPIRType::SPIRType(&write_type,local_3b8);
        write_type.vecsize = 1;
        write_type.columns = 1;
        local_330._M_dataplus._M_p._0_4_ = 0;
        if (pSVar11->vecsize != 0) {
          do {
            CompilerGLSL::to_enclosed_expression_abi_cxx11_
                      ((string *)&vector_type,&this->super_CompilerGLSL,lhs_expression,true);
            cVar18 = (char)&vector_type;
            uVar12 = ::std::__cxx11::string::rfind(cVar18,0x5b);
            uVar13 = ::std::__cxx11::string::rfind(cVar18,0x5d);
            uVar14 = ::std::__cxx11::string::rfind(cVar18,0x2e);
            if ((uVar14 != 0xffffffffffffffff) && (uVar13 < uVar14)) {
              ::std::__cxx11::string::resize((ulong)&vector_type,(char)uVar14);
            }
            if (uVar12 != 0xffffffffffffffff) {
              (*(local_3c0->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                        (&cast_expr,local_3c0,&write_type,0);
              packed_pfx = (char *)CONCAT71(packed_pfx._1_7_,0x5b);
              local_3c4 = CONCAT31(local_3c4._1_3_,0x5d);
              join<char,unsigned_int&,char,char_const(&)[2]>
                        (&rhs_row,(spirv_cross *)&packed_pfx,(char *)&local_330,&local_3c4,")",in_R9
                        );
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&vector_type,uVar12,(char *)0x0,
                                   (ulong)rhs_row._M_dataplus._M_p);
              pCVar2 = local_3c0;
              CompilerGLSL::to_extract_component_expression_abi_cxx11_
                        (&unpacked_expr,&local_3c0->super_CompilerGLSL,rhs_expression,
                         (uint)local_330._M_dataplus._M_p);
              in_R9 = (char (*) [2])0x2d3bcf;
              CompilerGLSL::
              statement<char_const(&)[3],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                        (&pCVar2->super_CompilerGLSL,(char (*) [3])0x2c57d9,&cast_addr_space,
                         (char (*) [2])0x2bb1d1,&cast_expr,(char (*) [4])0x2d3bcf,pbVar15,
                         (char (*) [4])0x2d3d47,&unpacked_expr,(char (*) [2])0x2d3bdb);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                              (uint)unpacked_expr._M_dataplus._M_p) != &unpacked_expr.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(unpacked_expr._M_dataplus._M_p._4_4_,
                                         (uint)unpacked_expr._M_dataplus._M_p));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)rhs_row._M_dataplus._M_p != &rhs_row.field_2) {
                operator_delete(rhs_row._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)cast_expr._M_dataplus._M_p != &cast_expr.field_2) {
                operator_delete(cast_expr._M_dataplus._M_p);
              }
            }
            if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.basetype) {
              operator_delete(vector_type.super_IVariant._vptr_IVariant);
            }
            local_330._M_dataplus._M_p._0_4_ = (uint)local_330._M_dataplus._M_p + 1;
            this = local_3c0;
          } while ((uint)local_330._M_dataplus._M_p < local_3b8->vecsize);
        }
        local_3b0->need_transpose = true;
        write_type.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_0035c188;
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable(&write_type.member_name_cache._M_h);
        write_type.member_type_index_redirection.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)
            write_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr !=
            &write_type.member_type_index_redirection.stack_storage) {
          free(write_type.member_type_index_redirection.super_VectorView<unsigned_int>.ptr);
        }
        write_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
        buffer_size = 0;
        if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
            write_type.member_types.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            ptr != &write_type.member_types.stack_storage) {
          free(write_type.member_types.
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr);
        }
        write_type.array_size_literal.super_VectorView<bool>.buffer_size = 0;
        if ((AlignedBuffer<bool,_8UL> *)write_type.array_size_literal.super_VectorView<bool>.ptr !=
            &write_type.array_size_literal.stack_storage) {
          free(write_type.array_size_literal.super_VectorView<bool>.ptr);
        }
        write_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
        if ((AlignedBuffer<unsigned_int,_8UL> *)write_type.array.super_VectorView<unsigned_int>.ptr
            == &write_type.array.stack_storage) goto LAB_00208e0a;
      }
      write_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
      free(write_type.array.super_VectorView<unsigned_int>.ptr);
LAB_00208e0a:
      Compiler::register_write((Compiler *)this,lhs_expression);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cast_addr_space._M_dataplus._M_p == &cast_addr_space.field_2) {
        return;
      }
      operator_delete(cast_addr_space._M_dataplus._M_p);
      return;
    }
    bVar3 = Compiler::is_matrix((Compiler *)this,local_3b8);
    pCVar2 = local_3c0;
    if ((local_3b0 == (SPIRExpression *)0x0) || (!bVar3)) {
      if (local_3b0 == (SPIRExpression *)0x0) goto LAB_00207db0;
      bVar6 = local_3b0->need_transpose;
    }
    else {
      bVar6 = local_3b0->need_transpose;
      if ((bool)bVar6 == true) {
        local_3b0->need_transpose = false;
        if ((local_360 == (SPIRExpression *)0x0) || (local_360->need_transpose != true)) {
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::to_unpacked_expression_abi_cxx11_
                    ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression,true);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[3]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [14])" = transpose(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [3])0x2b977c);
          if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.basetype) {
            operator_delete(vector_type.super_IVariant._vptr_IVariant);
          }
          if (write_type.super_IVariant._vptr_IVariant != (_func_int **)&write_type.basetype) {
            operator_delete(write_type.super_IVariant._vptr_IVariant);
          }
        }
        else {
          local_360->need_transpose = false;
          CompilerGLSL::to_expression_abi_cxx11_
                    ((string *)&write_type,&this->super_CompilerGLSL,lhs_expression,true);
          CompilerGLSL::to_unpacked_row_major_matrix_expression_abi_cxx11_
                    ((string *)&vector_type,&this->super_CompilerGLSL,rhs_expression);
          CompilerGLSL::
          statement<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &write_type,(char (*) [4])0x2d3d47,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type,(char (*) [2])0x2d3bdb);
          if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.basetype) {
            operator_delete(vector_type.super_IVariant._vptr_IVariant);
          }
          if (write_type.super_IVariant._vptr_IVariant != (_func_int **)&write_type.basetype) {
            operator_delete(write_type.super_IVariant._vptr_IVariant);
          }
          local_360->need_transpose = true;
        }
        local_3b0->need_transpose = true;
        goto LAB_002082e1;
      }
    }
    if ((bVar6 & 1) == 0) {
LAB_00207db0:
      CompilerGLSL::emit_store_statement(&this->super_CompilerGLSL,lhs_expression,rhs_expression);
      return;
    }
    local_3b0->need_transpose = false;
    cast_expr._M_dataplus._M_p = cast_expr._M_dataplus._M_p & 0xffffffff00000000;
    if (pSVar9->vecsize != 0) {
      do {
        CompilerGLSL::to_dereferenced_expression_abi_cxx11_
                  ((string *)&write_type,&local_3c0->super_CompilerGLSL,lhs_expression,true);
        uVar12 = ::std::__cxx11::string::rfind((char)&write_type,0x5b);
        if (uVar12 != 0xffffffffffffffff) {
          rhs_row._M_dataplus._M_p._0_1_ = 0x5b;
          unpacked_expr._M_dataplus._M_p._0_1_ = 0x5d;
          join<char,unsigned_int&,char>
                    ((string *)&vector_type,(spirv_cross *)&rhs_row,(char *)&cast_expr,
                     (uint *)&unpacked_expr,in_R8);
          pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ::std::__cxx11::string::replace
                              ((ulong)&write_type,uVar12,(char *)0x0,
                               (ulong)vector_type.super_IVariant._vptr_IVariant);
          CompilerGLSL::to_extract_component_expression_abi_cxx11_
                    (&cast_addr_space,&pCVar2->super_CompilerGLSL,rhs_expression,
                     (uint32_t)cast_expr._M_dataplus._M_p);
          in_R8 = ";";
          CompilerGLSL::
          statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&pCVar2->super_CompilerGLSL,pbVar15,(char (*) [4])0x2d3d47,&cast_addr_space,
                     (char (*) [2])0x2d3bdb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)cast_addr_space._M_dataplus._M_p != &cast_addr_space.field_2) {
            operator_delete(cast_addr_space._M_dataplus._M_p);
          }
          if (vector_type.super_IVariant._vptr_IVariant != (_func_int **)&vector_type.basetype) {
            operator_delete(vector_type.super_IVariant._vptr_IVariant);
          }
        }
        if (write_type.super_IVariant._vptr_IVariant != (_func_int **)&write_type.basetype) {
          operator_delete(write_type.super_IVariant._vptr_IVariant);
        }
        uVar8 = (uint32_t)cast_expr._M_dataplus._M_p + 1;
        cast_expr._M_dataplus._M_p._0_4_ = uVar8;
      } while (uVar8 < local_3b8->vecsize);
    }
    local_3b0->need_transpose = true;
    this = local_3c0;
  }
LAB_002082e1:
  Compiler::register_write((Compiler *)this,lhs_expression);
  return;
}

Assistant:

void CompilerMSL::emit_store_statement(uint32_t lhs_expression, uint32_t rhs_expression)
{
	auto &type = expression_type(rhs_expression);

	bool lhs_remapped_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID);
	bool lhs_packed_type = has_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypePacked);
	auto *lhs_e = maybe_get<SPIRExpression>(lhs_expression);
	auto *rhs_e = maybe_get<SPIRExpression>(rhs_expression);

	bool transpose = lhs_e && lhs_e->need_transpose;

	if (has_decoration(lhs_expression, DecorationBuiltIn) &&
	    BuiltIn(get_decoration(lhs_expression, DecorationBuiltIn)) == BuiltInSampleMask &&
	    is_array(type))
	{
		// Storing an array to SampleMask, have to remove the array-ness before storing.
		statement(to_expression(lhs_expression), " = ", to_enclosed_unpacked_expression(rhs_expression), "[0];");
		register_write(lhs_expression);
	}
	else if (!lhs_remapped_type && !lhs_packed_type)
	{
		// No physical type remapping, and no packed type, so can just emit a store directly.

		// We might not be dealing with remapped physical types or packed types,
		// but we might be doing a clean store to a row-major matrix.
		// In this case, we just flip transpose states, and emit the store, a transpose must be in the RHS expression, if any.
		if (is_matrix(type) && lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			if (rhs_e && rhs_e->need_transpose)
			{
				// Direct copy, but might need to unpack RHS.
				// Skip the transpose, as we will transpose when writing to LHS and transpose(transpose(T)) == T.
				rhs_e->need_transpose = false;
				statement(to_expression(lhs_expression), " = ", to_unpacked_row_major_matrix_expression(rhs_expression),
				          ";");
				rhs_e->need_transpose = true;
			}
			else
				statement(to_expression(lhs_expression), " = transpose(", to_unpacked_expression(rhs_expression), ");");

			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else if (lhs_e && lhs_e->need_transpose)
		{
			lhs_e->need_transpose = false;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_dereferenced_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');
				if (column_index != string::npos)
				{
					statement(lhs_expr.insert(column_index, join('[', c, ']')), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}
			lhs_e->need_transpose = true;
			register_write(lhs_expression);
		}
		else
			CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else if (!lhs_remapped_type && !is_matrix(type) && !transpose)
	{
		// Even if the target type is packed, we can directly store to it. We cannot store to packed matrices directly,
		// since they are declared as array of vectors instead, and we need the fallback path below.
		CompilerGLSL::emit_store_statement(lhs_expression, rhs_expression);
	}
	else
	{
		// Special handling when storing to a remapped physical type.
		// This is mostly to deal with std140 padded matrices or vectors.

		TypeID physical_type_id = lhs_remapped_type ?
		                              ID(get_extended_decoration(lhs_expression, SPIRVCrossDecorationPhysicalTypeID)) :
		                              type.self;

		auto &physical_type = get<SPIRType>(physical_type_id);

		string cast_addr_space = "thread";
		auto *p_var_lhs = maybe_get_backing_variable(lhs_expression);
		if (p_var_lhs)
			cast_addr_space = get_type_address_space(get<SPIRType>(p_var_lhs->basetype), lhs_expression);

		if (is_matrix(type))
		{
			const char *packed_pfx = lhs_packed_type ? "packed_" : "";

			// Packed matrices are stored as arrays of packed vectors, so we need
			// to assign the vectors one at a time.
			// For row-major matrices, we need to transpose the *right-hand* side,
			// not the left-hand side.

			// Lots of cases to cover here ...

			bool rhs_transpose = rhs_e && rhs_e->need_transpose;
			SPIRType write_type = type;
			string cast_expr;

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = false;

			if (transpose)
			{
				// We're dealing with transpose manually.
				lhs_e->need_transpose = false;
				write_type.vecsize = type.columns;
				write_type.columns = 1;

				if (physical_type.columns != type.columns)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					// If RHS is also transposed, we can just copy row by row.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_unpacked_row_major_matrix_expression(rhs_expression), "[", i, "];");
					}
				}
				else
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.vecsize = vector_type.columns;
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.vecsize; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							rhs_row += join(to_enclosed_unpacked_expression(rhs_expression), "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}

				// We're dealing with transpose manually.
				lhs_e->need_transpose = true;
			}
			else
			{
				write_type.columns = 1;

				if (physical_type.vecsize != type.vecsize)
					cast_expr = join("(", cast_addr_space, " ", packed_pfx, type_to_glsl(write_type), "&)");

				if (rhs_transpose)
				{
					auto vector_type = expression_type(rhs_expression);
					vector_type.columns = 1;

					// Transpose on the fly. Emitting a lot of full transpose() ops and extracting lanes seems very bad,
					// so pick out individual components instead.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						string rhs_row = type_to_glsl_constructor(vector_type) + "(";
						for (uint32_t j = 0; j < vector_type.vecsize; j++)
						{
							// Need to explicitly unpack expression since we've mucked with transpose state.
							auto unpacked_expr = to_unpacked_row_major_matrix_expression(rhs_expression);
							rhs_row += join(unpacked_expr, "[", j, "][", i, "]");
							if (j + 1 < vector_type.vecsize)
								rhs_row += ", ";
						}
						rhs_row += ")";

						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ", rhs_row, ";");
					}
				}
				else
				{
					// Copy column-by-column.
					for (uint32_t i = 0; i < type.columns; i++)
					{
						statement(cast_expr, to_enclosed_expression(lhs_expression), "[", i, "]", " = ",
						          to_enclosed_unpacked_expression(rhs_expression), "[", i, "];");
					}
				}
			}

			// We're dealing with transpose manually.
			if (rhs_transpose)
				rhs_e->need_transpose = true;
		}
		else if (transpose)
		{
			lhs_e->need_transpose = false;

			SPIRType write_type = type;
			write_type.vecsize = 1;
			write_type.columns = 1;

			// Storing a column to a row-major matrix. Unroll the write.
			for (uint32_t c = 0; c < type.vecsize; c++)
			{
				auto lhs_expr = to_enclosed_expression(lhs_expression);
				auto column_index = lhs_expr.find_last_of('[');

				// Get rid of any ".data" half8 handling here, we're casting to scalar anyway.
				auto end_column_index = lhs_expr.find_last_of(']');
				auto end_dot_index = lhs_expr.find_last_of('.');
				if (end_dot_index != string::npos && end_dot_index > end_column_index)
					lhs_expr.resize(end_dot_index);

				if (column_index != string::npos)
				{
					statement("((", cast_addr_space, " ", type_to_glsl(write_type), "*)&",
					          lhs_expr.insert(column_index, join('[', c, ']', ")")), " = ",
					          to_extract_component_expression(rhs_expression, c), ";");
				}
			}

			lhs_e->need_transpose = true;
		}
		else if ((is_matrix(physical_type) || is_array(physical_type)) &&
		         physical_type.vecsize <= 4 &&
		         physical_type.vecsize > type.vecsize)
		{
			assert(type.vecsize >= 1 && type.vecsize <= 3);

			// If we have packed types, we cannot use swizzled stores.
			// We could technically unroll the store for each element if needed.
			// When remapping to a std140 physical type, we always get float4,
			// and the packed decoration should always be removed.
			assert(!lhs_packed_type);

			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);

			// Unpack the expression so we can store to it with a float or float2.
			// It's still an l-value, so it's fine. Most other unpacking of expressions turn them into r-values instead.
			lhs = join("(", cast_addr_space, " ", type_to_glsl(type), "&)", enclose_expression(lhs));
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}
		else if (!is_matrix(type))
		{
			string lhs = to_dereferenced_expression(lhs_expression);
			string rhs = to_pointer_expression(rhs_expression);
			if (!optimize_read_modify_write(expression_type(rhs_expression), lhs, rhs))
				statement(lhs, " = ", rhs, ";");
		}

		register_write(lhs_expression);
	}
}